

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer_device.cpp
# Opt level: O2

Vec3fa __thiscall
embree::MatteMaterial__eval
          (embree *this,ISPCMatteMaterial *This,BRDF *brdf,Vec3fa *wo,DifferentialGeometry *dg,
          Vec3fa *wi)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  Lambertian lambertian;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_18;
  
  local_18._0_8_ = *(undefined8 *)&(This->reflectance).field_0;
  local_18._8_8_ = *(undefined8 *)((long)&(This->reflectance).field_0 + 8);
  aVar1 = (anon_union_16_2_47237d3f_for_Vec3fa_0)
          Lambertian__eval((Lambertian *)&local_18.field_1,wo,dg,wi);
  return (Vec3fa)aVar1;
}

Assistant:

Vec3fa MatteMaterial__eval(ISPCMatteMaterial* This, const BRDF& brdf, const Vec3fa& wo, const DifferentialGeometry& dg, const Vec3fa& wi)
{
  Lambertian lambertian = make_Lambertian(Vec3fa((Vec3fa)This->reflectance));
  return Lambertian__eval(&lambertian,wo,dg,wi);
}